

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::iterate(Texture3DMipmapCase *this)

{
  CoordType CVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  Texture3D *this_00;
  undefined4 extraout_var_00;
  char *pcVar9;
  reference pvVar10;
  RenderTarget *this_01;
  PixelFormat *format;
  Texture3D *this_02;
  qpWatchDog *watchDog;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  bool bVar13;
  bool bVar14;
  Texture3DView TVar15;
  int local_964;
  int local_960;
  bool local_959;
  int local_924;
  int local_920;
  allocator<char> local_8e9;
  undefined1 local_8e8 [6];
  bool isOk;
  allocator<char> local_8c1;
  string local_8c0;
  LogImage local_8a0;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  LogImage local_7c0;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  LogImage local_6e0;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  LogImageSet local_600;
  MessageBuilder local_5c0;
  Texture3DView local_440;
  PixelBufferAccess local_430;
  PixelBufferAccess local_408;
  PixelBufferAccess local_3e0;
  ConstPixelBufferAccess local_3b8;
  PixelBufferAccess local_390;
  ConstPixelBufferAccess local_368;
  Texture3DView local_340;
  SurfaceAccess local_330;
  int local_310;
  int local_30c;
  int cellNdx_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int gridX_1;
  int gridY_1;
  Vector<int,_4> local_2e0;
  Vector<int,_4> local_2d0;
  IVec4 local_2c0;
  tcu local_2b0 [8];
  float afStack_2a8 [2];
  Vector<int,_3> local_2a0;
  Vector<int,_3> local_294;
  int local_288;
  undefined1 local_284 [4];
  int numFailedPixels;
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  Surface errorMask;
  Surface referenceFrame;
  bool isTrilinear;
  PixelFormat *pixelFormat;
  int local_1dc;
  int local_1d8;
  int cellNdx;
  int curH;
  int curW;
  int curY;
  int curX;
  int gridX;
  int gridY;
  Sampler local_1a4;
  undefined1 local_168 [8];
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  ReferenceParams sampleParams;
  int cellHeight;
  int cellWidth;
  int gridHeight;
  int gridWidth;
  bool useLodBias;
  int iStack_8c;
  bool isProjected;
  RandomViewport viewport;
  RenderTarget *renderTarget;
  deUint32 magFilter;
  int texHeight;
  int texWidth;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  Texture3D *refTexture;
  Functions *gl;
  Texture3DMipmapCase *this_local;
  long lVar8;
  
  pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  this_00 = glu::Texture3D::getRefTexture(this->m_texture);
  fmtInfo.lookupBias.m_data._8_8_ =
       tcu::TextureLevelPyramid::getFormat(&this_00->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&texHeight,(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_);
  iVar3 = tcu::Texture3D::getWidth(this_00);
  iVar4 = tcu::Texture3D::getHeight(this_00);
  pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[4])();
  viewport._8_8_ = (RenderTarget *)CONCAT44(extraout_var_00,iVar5);
  pcVar9 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar9);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&gridWidth,(RenderTarget *)CONCAT44(extraout_var_00,iVar5),iVar3 << 2
             ,iVar4 << 2,dVar6);
  bVar13 = this->m_coordType == COORDTYPE_PROJECTED;
  bVar14 = this->m_coordType == COORDTYPE_BASIC_BIAS;
  iVar3 = viewport.x;
  if (viewport.x < 0) {
    iVar3 = viewport.x + 3;
  }
  sampleParams.maxLevel = iVar3 >> 2;
  iVar3 = viewport.y;
  if (viewport.y < 0) {
    iVar3 = viewport.y + 3;
  }
  sampleParams.baseLevel = iVar3 >> 2;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)&renderedFrame.m_pixels.m_cap,TEXTURETYPE_3D);
  tcu::Surface::Surface
            ((Surface *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,viewport.x,viewport.y);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_168);
  glu::mapGLSampler(&local_1a4,this->m_wrapS,this->m_wrapT,this->m_wrapR,this->m_minFilter,0x2600);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_1a4);
  _gridX = *(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_;
  renderedFrame.m_pixels.m_cap._4_4_ = glu::TextureTestUtil::getSamplerType(_gridX);
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  sampleParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  sampleParams.super_RenderParams.texType = (uint)bVar13 + (uint)bVar14 * 2;
  pcVar2 = *(code **)(lVar8 + 0xb8);
  dVar6 = glu::Texture3D::getGLTexture(this->m_texture);
  (*pcVar2)(0x806f,dVar6);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2802,this->m_wrapS);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2803,this->m_wrapT);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x8072,this->m_wrapR);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar8 + 0x1360))(0x806f,0x2800,0x2600);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x505);
  if ((iterate()::s_projections == '\0') &&
     (iVar3 = __cxa_guard_acquire(&iterate()::s_projections), iVar3 != 0)) {
    tcu::Vector<float,_4>::Vector(iterate::s_projections,1.2,1.0,0.7,1.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 1,1.3,0.8,0.6,2.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 2,0.8,1.0,1.7,0.6);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 3,1.2,1.0,1.7,1.5);
    __cxa_guard_release(&iterate()::s_projections);
  }
  curX = 0;
  do {
    if (3 < curX) {
      pRVar7 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&pixelFormat,
                 (Surface *)
                 &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      glu::readPixels(pRVar7,gridWidth,iStack_8c,(PixelBufferAccess *)&pixelFormat);
      this_01 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
      format = tcu::RenderTarget::getPixelFormat(this_01);
      local_959 = true;
      if (this->m_minFilter != 0x2702) {
        local_959 = this->m_minFilter == 0x2703;
      }
      tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,viewport.x,viewport.y);
      tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,viewport.x,viewport.y);
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
      tcu::LodPrecision::LodPrecision((LodPrecision *)local_284,RULE_OPENGL);
      local_288 = 0;
      tcu::Vector<int,_3>::Vector(&local_294,0x14,0x14,0x14);
      lookupPrec.coordBits.m_data[0] = local_294.m_data[2];
      lodPrec.derivateBits = local_294.m_data[0];
      lodPrec.lodBits = local_294.m_data[1];
      tcu::Vector<int,_3>::Vector(&local_2a0,0x10,0x10,0x10);
      lookupPrec.uvwBits.m_data[0] = local_2a0.m_data[2];
      lookupPrec.coordBits.m_data[1] = local_2a0.m_data[0];
      lookupPrec.coordBits.m_data[2] = local_2a0.m_data[1];
      glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&local_2e0,format);
      tcu::operator-((tcu *)&local_2d0,&local_2e0,local_959 + 1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&gridY_1,0);
      tcu::max<int,4>((tcu *)&local_2c0,&local_2d0,(Vector<int,_4> *)&gridY_1);
      tcu::computeFixedPointThreshold(local_2b0,&local_2c0);
      lookupPrec.uvwBits.m_data._4_8_ = local_2b0;
      lookupPrec.colorThreshold.m_data[0] = afStack_2a8[0];
      lookupPrec.colorThreshold.m_data[1] = afStack_2a8[1];
      glu::TextureTestUtil::getCompareMask((TextureTestUtil *)&gridX_1,format);
      lookupPrec.colorThreshold.m_data[2] = (float)gridX_1;
      numFailedPixels = 10;
      lodPrec.rule = 8;
      if (bVar13) {
        lodPrec.rule = 6;
      }
      curX_1 = 0;
      do {
        if (3 < curX_1) {
          if (0 < local_288) {
            pTVar11 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_5c0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar12 = tcu::MessageBuilder::operator<<
                                (&local_5c0,
                                 (char (*) [41])"ERROR: Image verification failed, found ");
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_288);
            pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [17])" invalid pixels!");
            tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_5c0);
          }
          pTVar11 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_620,"Result",&local_621);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_648,"Verification result",&local_649);
          tcu::LogImageSet::LogImageSet(&local_600,&local_620,&local_648);
          pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_600);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_700,"Rendered",&local_701);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_728,"Rendered image",&local_729);
          tcu::LogImage::LogImage
                    (&local_6e0,&local_700,&local_728,
                     (Surface *)
                     &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::TestLog::operator<<(pTVar11,&local_6e0);
          tcu::LogImage::~LogImage(&local_6e0);
          std::__cxx11::string::~string((string *)&local_728);
          std::allocator<char>::~allocator(&local_729);
          std::__cxx11::string::~string((string *)&local_700);
          std::allocator<char>::~allocator(&local_701);
          tcu::LogImageSet::~LogImageSet(&local_600);
          std::__cxx11::string::~string((string *)&local_648);
          std::allocator<char>::~allocator(&local_649);
          std::__cxx11::string::~string((string *)&local_620);
          std::allocator<char>::~allocator(&local_621);
          if (0 < local_288) {
            pTVar11 = tcu::TestContext::getLog
                                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7e0,"Reference",&local_7e1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_808,"Ideal reference",&local_809);
            tcu::LogImage::LogImage
                      (&local_7c0,&local_7e0,&local_808,(Surface *)&errorMask.m_pixels.m_cap,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_7c0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8c0,"ErrorMask",&local_8c1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_8e8,"Error mask",&local_8e9);
            tcu::LogImage::LogImage
                      (&local_8a0,&local_8c0,(string *)local_8e8,(Surface *)&lookupPrec.colorMask,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::TestLog::operator<<(pTVar11,&local_8a0);
            tcu::LogImage::~LogImage(&local_8a0);
            std::__cxx11::string::~string((string *)local_8e8);
            std::allocator<char>::~allocator(&local_8e9);
            std::__cxx11::string::~string((string *)&local_8c0);
            std::allocator<char>::~allocator(&local_8c1);
            tcu::LogImage::~LogImage(&local_7c0);
            std::__cxx11::string::~string((string *)&local_808);
            std::allocator<char>::~allocator(&local_809);
            std::__cxx11::string::~string((string *)&local_7e0);
            std::allocator<char>::~allocator(&local_7e1);
          }
          pTVar11 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
          pcVar9 = "Image verification failed";
          if (local_288 == 0) {
            pcVar9 = "Pass";
          }
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     (byte)~(local_288 == 0) & QP_TEST_RESULT_FAIL,pcVar9);
          tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
          tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_168);
          tcu::Surface::~Surface
                    ((Surface *)
                     &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          return STOP;
        }
        for (curY_1 = 0; curY_1 < 4; curY_1 = curY_1 + 1) {
          curW_1 = sampleParams.maxLevel * curY_1;
          curH_1 = sampleParams.baseLevel * curX_1;
          if (curY_1 == 3) {
            local_960 = viewport.x - curW_1;
          }
          else {
            local_960 = sampleParams.maxLevel;
          }
          cellNdx_1 = local_960;
          if (curX_1 == 3) {
            local_964 = viewport.y - curH_1;
          }
          else {
            local_964 = sampleParams.baseLevel;
          }
          local_30c = local_964;
          local_310 = curY_1 + curX_1 * 4;
          CVar1 = this->m_coordType;
          if (CVar1 < COORDTYPE_AFFINE) {
LAB_01c4621a:
            getBasicTexCoord3D((vector<float,_std::allocator<float>_> *)local_168,local_310);
          }
          else if (CVar1 == COORDTYPE_AFFINE) {
            getAffineTexCoord3D((vector<float,_std::allocator<float>_> *)local_168,local_310);
          }
          else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_01c4621a;
          if (bVar13) {
            sampleParams.super_RenderParams.samplerType =
                 (SamplerType)iterate::s_projections[local_310 % 4].m_data[0];
            sampleParams.super_RenderParams.flags =
                 (deUint32)iterate::s_projections[local_310 % 4].m_data[1];
            sampleParams.super_RenderParams.w.m_data._0_8_ =
                 *(undefined8 *)(iterate::s_projections[local_310 % 4].m_data + 2);
          }
          if (bVar14) {
            sampleParams.super_RenderParams.w.m_data[2] = iterate::s_bias[local_310 % 8];
          }
          tcu::SurfaceAccess::SurfaceAccess
                    (&local_330,(Surface *)&errorMask.m_pixels.m_cap,format,curW_1,curH_1,cellNdx_1,
                     local_30c);
          TVar15 = tcu::Texture3D::operator_cast_to_Texture3DView(this_00);
          local_340.m_levels = TVar15.m_levels;
          local_340.m_numLevels = TVar15.m_numLevels;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_168,0);
          glu::TextureTestUtil::sampleTexture
                    (&local_330,&local_340,pvVar10,(ReferenceParams *)&renderedFrame.m_pixels.m_cap)
          ;
          tcu::Surface::getAccess
                    (&local_390,
                     (Surface *)
                     &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          tcu::getSubregion((PixelBufferAccess *)&local_368,&local_390,curW_1,curH_1,cellNdx_1,
                            local_30c);
          tcu::Surface::getAccess(&local_3e0,(Surface *)&errorMask.m_pixels.m_cap);
          tcu::getSubregion((PixelBufferAccess *)&local_3b8,&local_3e0,curW_1,curH_1,cellNdx_1,
                            local_30c);
          tcu::Surface::getAccess(&local_430,(Surface *)&lookupPrec.colorMask);
          tcu::getSubregion(&local_408,&local_430,curW_1,curH_1,cellNdx_1,local_30c);
          this_02 = glu::Texture3D::getRefTexture(this->m_texture);
          TVar15 = tcu::Texture3D::operator_cast_to_Texture3DView(this_02);
          local_440.m_levels = TVar15.m_levels;
          local_440.m_numLevels = TVar15.m_numLevels;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_168,0);
          watchDog = tcu::TestContext::getWatchDog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          iVar3 = glu::TextureTestUtil::computeTextureLookupDiff
                            (&local_368,&local_3b8,&local_408,&local_440,pvVar10,
                             (ReferenceParams *)&renderedFrame.m_pixels.m_cap,
                             (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_284,
                             watchDog);
          local_288 = iVar3 + local_288;
        }
        curX_1 = curX_1 + 1;
      } while( true );
    }
    for (curY = 0; curY < 4; curY = curY + 1) {
      curW = sampleParams.maxLevel * curY;
      curH = sampleParams.baseLevel * curX;
      if (curY == 3) {
        local_920 = viewport.x - curW;
      }
      else {
        local_920 = sampleParams.maxLevel;
      }
      cellNdx = local_920;
      if (curX == 3) {
        local_924 = viewport.y - curH;
      }
      else {
        local_924 = sampleParams.baseLevel;
      }
      local_1d8 = local_924;
      local_1dc = curY + curX * 4;
      CVar1 = this->m_coordType;
      if (CVar1 < COORDTYPE_AFFINE) {
LAB_01c45d3e:
        getBasicTexCoord3D((vector<float,_std::allocator<float>_> *)local_168,local_1dc);
      }
      else if (CVar1 == COORDTYPE_AFFINE) {
        getAffineTexCoord3D((vector<float,_std::allocator<float>_> *)local_168,local_1dc);
      }
      else if (CVar1 == COORDTYPE_PROJECTED) goto LAB_01c45d3e;
      if (bVar13) {
        sampleParams.super_RenderParams.samplerType =
             (SamplerType)iterate::s_projections[local_1dc % 4].m_data[0];
        sampleParams.super_RenderParams.flags =
             (deUint32)iterate::s_projections[local_1dc % 4].m_data[1];
        sampleParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)(iterate::s_projections[local_1dc % 4].m_data + 2);
      }
      if (bVar14) {
        sampleParams.super_RenderParams.w.m_data[2] = iterate::s_bias[local_1dc % 8];
      }
      (**(code **)(lVar8 + 0x1a00))(gridWidth + curW,iStack_8c + curH,cellNdx,local_1d8);
      pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)local_168,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar10,(RenderParams *)&renderedFrame.m_pixels.m_cap);
    }
    curX = curX + 1;
  } while( true );
}

Assistant:

Texture3DMipmapCase::IterateResult Texture3DMipmapCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();
	const deUint32					magFilter			= GL_NEAREST;

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	const bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	const bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		m_wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int		curX		= cellWidth*gridX;
			const int		curY		= cellHeight*gridY;
			const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			const int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			// Set projection.
			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			// Set LOD bias.
			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				switch (m_coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord3D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord3D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}